

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

ON_Brep * __thiscall ON_Hatch::BrepForm(ON_Hatch *this,ON_Brep *brep)

{
  double *this_00;
  int iVar1;
  int si;
  ON_Plane *pOVar2;
  ON_PlaneSurface *this_01;
  ON_HatchLoop *this_02;
  ON_Curve *pOVar3;
  ON_BrepFace *pOVar4;
  ON_Brep *local_168;
  ON_BrepFace *face;
  ON_Interval local_140;
  undefined1 local_130 [8];
  ON_BoundingBox bbox;
  ON_SimpleArray<ON_Curve_*> bounds;
  ON_Curve *edgecurve;
  ON_Curve *loopcurve;
  ON_HatchLoop *loop;
  int i;
  int loopcount;
  int face_i;
  int srf_i;
  ON_PlaneSurface *srf;
  ON_Plane plane;
  ON_Brep *newbrep;
  ON_Brep *brep_local;
  ON_Hatch *this_local;
  
  if (brep == (ON_Brep *)0x0) {
    local_168 = ON_Brep::New();
  }
  else {
    ON_Brep::Destroy(brep);
    local_168 = brep;
  }
  plane.plane_equation.d = (double)local_168;
  if (local_168 == (ON_Brep *)0x0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hatch.cpp"
               ,0x716,"","Unable to get allocate brep.");
    this_local = (ON_Hatch *)0x0;
  }
  else {
    pOVar2 = Plane(this);
    plane.plane_equation.y = (pOVar2->plane_equation).z;
    plane.plane_equation.z = (pOVar2->plane_equation).d;
    plane.zaxis.z = (pOVar2->plane_equation).x;
    plane.plane_equation.x = (pOVar2->plane_equation).y;
    plane.zaxis.x = (pOVar2->zaxis).y;
    plane.zaxis.y = (pOVar2->zaxis).z;
    plane.yaxis.y = (pOVar2->yaxis).z;
    plane.yaxis.z = (pOVar2->zaxis).x;
    srf = (ON_PlaneSurface *)(pOVar2->origin).x;
    plane.origin.x = (pOVar2->origin).y;
    plane.origin.y = (pOVar2->origin).z;
    plane.origin.z = (pOVar2->xaxis).x;
    plane.xaxis.x = (pOVar2->xaxis).y;
    plane.xaxis.y = (pOVar2->xaxis).z;
    plane.xaxis.z = (pOVar2->yaxis).x;
    plane.yaxis.x = (pOVar2->yaxis).y;
    this_01 = (ON_PlaneSurface *)operator_new(0xd0);
    ON_PlaneSurface::ON_PlaneSurface(this_01,(ON_Plane *)&srf);
    i = -1;
    iVar1 = LoopCount(this);
    for (loop._4_4_ = 0; loop._4_4_ < iVar1; loop._4_4_ = loop._4_4_ + 1) {
      this_02 = Loop(this,loop._4_4_);
      pOVar3 = ON_HatchLoop::Curve(this_02);
      bounds._16_8_ = LoopCurve3d(this,loop._4_4_);
      this_00 = &bbox.m_max.z;
      ON_SimpleArray<ON_Curve_*>::ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)this_00);
      ON_SimpleArray<ON_Curve_*>::Append
                ((ON_SimpleArray<ON_Curve_*> *)this_00,(ON_Curve **)&bounds.m_count);
      if (loop._4_4_ == 0) {
        ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)local_130);
        (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                  (pOVar3,(ON_BoundingBox *)local_130,&bbox.m_min.z,0);
        ON_Interval::ON_Interval(&local_140,(double)local_130 - 1.0,bbox.m_min.z + 1.0);
        ON_PlaneSurface::SetExtents(this_01,0,local_140,true);
        ON_Interval::ON_Interval((ON_Interval *)&face,bbox.m_min.x - 1.0,bbox.m_max.x + 1.0);
        ON_PlaneSurface::SetExtents(this_01,1,_face,true);
        si = ON_Brep::AddSurface(local_168,(ON_Surface *)this_01);
        pOVar4 = ON_Brep::NewFace(local_168,si);
        i = pOVar4->m_face_index;
        ON_Brep::NewPlanarFaceLoop
                  (local_168,i,outer,(ON_SimpleArray<ON_Curve_*> *)&bbox.m_max.z,false);
      }
      else {
        ON_Brep::NewPlanarFaceLoop
                  (local_168,i,inner,(ON_SimpleArray<ON_Curve_*> *)&bbox.m_max.z,false);
      }
      ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&bbox.m_max.z);
    }
    ON_Brep::SetTolerancesBoxesAndFlags(local_168,false,true,true,true,true,true,true,true);
    this_local = (ON_Hatch *)local_168;
    ON_Plane::~ON_Plane((ON_Plane *)&srf);
  }
  return (ON_Brep *)this_local;
}

Assistant:

ON_Brep* ON_Hatch::BrepForm(ON_Brep* brep) const
{
  if (brep)
    brep->Destroy();

  ON_Brep* newbrep = brep ? brep : ON_Brep::New();

  if (0 == newbrep)
  {
    ON_ERROR("Unable to get allocate brep.");
    return 0;
  }
  brep = newbrep;

  ON_Plane plane = Plane();
  ON_PlaneSurface* srf = new ON_PlaneSurface(plane);
  int srf_i = -1, face_i = -1;

  int loopcount = LoopCount();
  for (int i = 0; i < loopcount; i++)
  {
    const ON_HatchLoop* loop = Loop(i);
    const ON_Curve* loopcurve = loop->Curve();
    ON_Curve* edgecurve = this->LoopCurve3d(i);
    ON_SimpleArray< ON_Curve* > bounds;
    bounds.Append(edgecurve);

    if (i == 0)
    {
      ON_BoundingBox bbox;
      loopcurve->GetBBox(&bbox.m_min.x, &bbox.m_max.x, false);
      srf->SetExtents(0, ON_Interval(bbox.m_min.x - 1.0, bbox.m_max.x + 1.0), true);
      srf->SetExtents(1, ON_Interval(bbox.m_min.y - 1.0, bbox.m_max.y + 1.0), true);
      srf_i = brep->AddSurface(srf);
      ON_BrepFace& face = brep->NewFace(srf_i);
      face_i = face.m_face_index;
      brep->NewPlanarFaceLoop(face_i, ON_BrepLoop::TYPE::outer, bounds, false);
    }
    else
      brep->NewPlanarFaceLoop(face_i, ON_BrepLoop::TYPE::inner, bounds, false);
  }
  brep->SetTolerancesBoxesAndFlags();

  return brep;
}